

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O1

bool __thiscall
capnp::anon_unknown_1::CapnpcCppMain::TemplateContext::hasParams(TemplateContext *this)

{
  PointerReader local_58;
  ListReader local_38;
  
  if ((this->node)._reader.pointerCount < 6) {
    local_58.nestingLimit = 0x7fffffff;
    local_58.capTable = (CapTableReader *)0x0;
    local_58.pointer = (WirePointer *)0x0;
    local_58.segment = (SegmentReader *)0x0;
  }
  else {
    local_58.segment = (this->node)._reader.segment;
    local_58.capTable = (this->node)._reader.capTable;
    local_58.pointer = (this->node)._reader.pointers + 5;
    local_58.nestingLimit = (this->node)._reader.nestingLimit;
  }
  _::PointerReader::getList(&local_38,&local_58,INLINE_COMPOSITE,(word *)0x0);
  return local_38.elementCount != 0;
}

Assistant:

inline PointerReader StructReader::getPointerField(StructPointerOffset ptrIndex) const {
  if (ptrIndex < pointerCount) {
    // Hacky because WirePointer is defined in the .c++ file (so is incomplete here).
    return PointerReader(segment, capTable, reinterpret_cast<const WirePointer*>(
        reinterpret_cast<const word*>(pointers) + ptrIndex * WORDS_PER_POINTER), nestingLimit);
  } else{
    return PointerReader();
  }
}